

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result-c.cpp
# Opt level: O3

idx_t duckdb_column_count(duckdb_result *result)

{
  pointer this;
  idx_t iVar1;
  
  if ((result != (duckdb_result *)0x0) &&
     ((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
      result->internal_data !=
      (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)0x0)) {
    this = duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
           operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                       *)result->internal_data);
    iVar1 = duckdb::BaseQueryResult::ColumnCount(&this->super_BaseQueryResult);
    return iVar1;
  }
  return 0;
}

Assistant:

idx_t duckdb_column_count(duckdb_result *result) {
	if (!result) {
		return 0;
	}
	if (result->internal_data == NULL) {
		return 0;
	}
	auto &result_data = *(reinterpret_cast<duckdb::DuckDBResultData *>(result->internal_data));
	return result_data.result->ColumnCount();
}